

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferObjectQueryTests.cpp
# Opt level: O3

void __thiscall deqp::gles3::Functional::anon_unknown_2::BufferCase::test(BufferCase *this)

{
  CallLogWrapper *this_00;
  long lVar1;
  GLenum *pGVar2;
  GLuint bufferId;
  GLuint local_2c;
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  lVar1 = (ulong)this->m_testAllTargets * 4 + 4;
  pGVar2 = &DAT_00b13b60;
  do {
    this->m_bufferTarget = *pGVar2;
    local_2c = 0;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&local_2c);
    glu::CallLogWrapper::glBindBuffer(this_00,this->m_bufferTarget,local_2c);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])(this);
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,&local_2c);
    ApiCase::expectError(&this->super_ApiCase,0);
    pGVar2 = pGVar2 + 1;
    lVar1 = lVar1 + -1;
  } while (lVar1 != 0);
  return;
}

Assistant:

void test (void)
	{
		const GLenum bufferTargets[] =
		{
			GL_ARRAY_BUFFER, GL_COPY_READ_BUFFER,
			GL_TRANSFORM_FEEDBACK_BUFFER, GL_UNIFORM_BUFFER,

			GL_COPY_WRITE_BUFFER, GL_ELEMENT_ARRAY_BUFFER,
			GL_PIXEL_PACK_BUFFER, GL_PIXEL_UNPACK_BUFFER
		};

		// most test need only to be run with a subset of targets
		const int targets = m_testAllTargets ? DE_LENGTH_OF_ARRAY(bufferTargets) : 4;

		for (int ndx = 0; ndx < targets; ++ndx)
		{
			m_bufferTarget = bufferTargets[ndx];

			GLuint bufferId = 0;
			glGenBuffers(1, &bufferId);
			glBindBuffer(m_bufferTarget, bufferId);
			expectError(GL_NO_ERROR);

			testBuffer();

			glDeleteBuffers(1, &bufferId);
			expectError(GL_NO_ERROR);
		}
	}